

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::DOM::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,DOM *p_pcOut,PLYImporter *loader,bool p_bBE)

{
  bool bVar1;
  Logger *pLVar2;
  size_type sVar3;
  reference local_68;
  char *pCur;
  undefined4 local_58;
  uint bufferSize;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> buffer;
  bool p_bBE_local;
  PLYImporter *loader_local;
  DOM *p_pcOut_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = p_bBE;
  if (p_pcOut == (DOM *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x264,
                  "static bool Assimp::PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &, DOM *, PLYImporter *, bool)"
                 );
  }
  if (loader != (PLYImporter *)0x0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    IOStreamBuffer<char>::getNextLine(streamBuffer,(vector<char,_std::allocator<char>_> *)local_48);
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"PLY::DOM::ParseInstanceBinary() begin");
    bVar1 = ParseHeader(p_pcOut,streamBuffer,(vector<char,_std::allocator<char>_> *)local_48,true);
    if (bVar1) {
      IOStreamBuffer<char>::getNextBlock
                (streamBuffer,(vector<char,_std::allocator<char>_> *)local_48);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_48);
      pCur._4_4_ = (undefined4)sVar3;
      local_68 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_48,0);
      bVar1 = ParseElementInstanceListsBinary
                        (p_pcOut,streamBuffer,(vector<char,_std::allocator<char>_> *)local_48,
                         &local_68,(uint *)((long)&pCur + 4),loader,
                         (bool)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                _23_1_ & 1));
      if (bVar1) {
        pLVar2 = DefaultLogger::get();
        Logger::debug(pLVar2,"PLY::DOM::ParseInstanceBinary() succeeded");
        streamBuffer_local._7_1_ = true;
      }
      else {
        pLVar2 = DefaultLogger::get();
        Logger::debug(pLVar2,"PLY::DOM::ParseInstanceBinary() failure");
        streamBuffer_local._7_1_ = false;
      }
    }
    else {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"PLY::DOM::ParseInstanceBinary() failure");
      streamBuffer_local._7_1_ = false;
    }
    local_58 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    return streamBuffer_local._7_1_;
  }
  __assert_fail("__null != loader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x265,
                "static bool Assimp::PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &, DOM *, PLYImporter *, bool)"
               );
}

Assistant:

bool PLY::DOM::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, DOM* p_pcOut, PLYImporter* loader, bool p_bBE)
{
  ai_assert(NULL != p_pcOut);
  ai_assert(NULL != loader);

  std::vector<char> buffer;
  streamBuffer.getNextLine(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() begin");

  if (!p_pcOut->ParseHeader(streamBuffer, buffer, true))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() failure");
    return false;
  }

  streamBuffer.getNextBlock(buffer);
  unsigned int bufferSize = static_cast<unsigned int>(buffer.size());
  const char* pCur = (char*)&buffer[0];
  if (!p_pcOut->ParseElementInstanceListsBinary(streamBuffer, buffer, pCur, bufferSize, loader, p_bBE))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() failure");
    return false;
  }
  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstanceBinary() succeeded");
  return true;
}